

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O1

bool __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::Add(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
      *this,JavascriptPromise *key,int data)

{
  uint targetBucket;
  EntryType *pEVar1;
  bool bVar2;
  bool bVar3;
  
  targetBucket = HashKeyToBucket(this,key,this->size);
  pEVar1 = this->table[targetBucket];
  if (pEVar1 == (EntryType *)0x0) {
    bVar2 = true;
  }
  else {
    do {
      bVar3 = pEVar1->key == key;
      bVar2 = !bVar3;
      if (bVar3) break;
      pEVar1 = pEVar1->next;
    } while (pEVar1 != (SimpleHashEntry<Js::JavascriptPromise_*,_int> *)0x0);
  }
  if (bVar2 != false) {
    AddInternal(this,key,data,targetBucket);
  }
  return bVar2;
}

Assistant:

bool Add(TKey key, TData data)
    {
        uint targetBucket = HashKeyToBucket(key);

        if(FindEntry(key, targetBucket) != nullptr)
        {
            return false;
        }

        AddInternal(key, data, targetBucket);
        return true;
    }